

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double discrete_pdf(int x,int a,double *b)

{
  double dVar1;
  double dVar2;
  
  dVar1 = r8vec_sum(a,b);
  dVar2 = 0.0;
  if (x <= a && 0 < x) {
    dVar2 = b[(ulong)(uint)x - 1] / dVar1;
  }
  return dVar2;
}

Assistant:

double discrete_pdf ( int x, int a, double b[] )

//****************************************************************************80
//
//  Purpose:
//
//    DISCRETE_PDF evaluates the Discrete PDF.
//
//  Discusion:
//
//    PDF(A,B;X) = B(X) if 1 <= X <= A
//                = 0    otherwise
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the item whose probability is desired.
//
//    Input, int A, the number of probabilities assigned.
//
//    Input, double B[A], the relative probabilities of
//    outcomes 1 through A.  Each entry must be nonnegative.
//
//    Output, double DISCRETE_PDF, the value of the PDF.
//
{
  double b_sum;
  double pdf;

  b_sum = r8vec_sum ( a, b );

  if ( 1 <= x && x <= a )
  {
    pdf = b[x-1] / b_sum;
  }
  else
  {
    pdf = 0.0;
  }

  return pdf;
}